

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

void mg_serve_http(mg_connection *nc,http_message *hm,mg_serve_http_opts opts)

{
  char cVar1;
  http_message *phVar2;
  mg_connection *conn;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  char *list;
  char *pcVar6;
  undefined1 *puVar7;
  char *p;
  char *pcVar8;
  long lVar9;
  undefined1 auStack_2078 [8];
  http_message *local_2070;
  mg_str *local_2068;
  mg_connection *local_2060;
  mg_str b;
  mg_str local_2048;
  char uri [4096];
  char path [4096];
  
  list = opts.url_rewrites;
  puVar7 = auStack_2078;
  uri[0] = '%';
  uri[1] = '\0';
  uri[2] = '\0';
  uri[3] = '\0';
  uri[4] = '\0';
  uri[5] = '\0';
  uri[6] = '\0';
  uri[7] = '\0';
  uri[8] = '\0';
  uri[9] = '\0';
  uri[10] = '\0';
  uri[0xb] = '\0';
  uri[0xc] = '\0';
  uri[0xd] = '\0';
  uri[0xe] = '\0';
  uri[0xf] = '\0';
  uri[0x10] = '\0';
  uri[0x11] = '\0';
  uri[0x12] = '\0';
  uri[0x13] = '\0';
  local_2070 = hm;
  local_2060 = nc;
  mg_sock_to_str(nc->sock,uri + 1,0x13,2);
  pcVar6 = uri;
  pcVar5 = list;
  while (pcVar5 = mg_next_comma_list_entry(pcVar5,(mg_str *)path,&b), phVar2 = local_2070,
        pcVar5 != (char *)0x0) {
    iVar3 = mg_vcmp((mg_str *)path,pcVar6);
    conn = local_2060;
    if (iVar3 == 0) {
      mg_send_response_line(local_2060,0x12d,(char *)0x0);
      mg_printf(conn,"Content-Length: 0\r\nLocation: %.*s%.*s\r\n\r\n",(ulong)(uint)b.len,b.p,
                (ulong)(~(uint)(local_2070->uri).p + *(int *)&(local_2070->proto).p));
      return;
    }
  }
  if (opts.document_root == (char *)0x0) {
    opts.document_root = ".";
  }
  pcVar5 = opts.document_root;
  if (opts.per_directory_auth_file == (char *)0x0) {
    opts.per_directory_auth_file = ".htpasswd";
  }
  if (opts.enable_directory_listing == (char *)0x0) {
    opts.enable_directory_listing = "yes";
  }
  if (opts.cgi_file_pattern == (char *)0x0) {
    opts.cgi_file_pattern = "**.cgi$|**.php$";
  }
  if (opts.ssi_pattern == (char *)0x0) {
    opts.ssi_pattern = "**.shtml$|**.shtm$";
  }
  if (opts.index_files == (char *)0x0) {
    opts.index_files = "index.html,index.htm,index.shtml,index.cgi,index.php";
  }
  local_2068 = mg_get_http_header(local_2070,"Host");
  mg_url_decode((phVar2->uri).p,(int)(phVar2->uri).len,pcVar6,0x1000,0);
  pcVar8 = pcVar6;
  while (*pcVar6 != '\0') {
    *pcVar8 = *pcVar6;
    pcVar8 = pcVar8 + 1;
    cVar1 = *pcVar6;
    pcVar6 = pcVar6 + 1;
    if ((cVar1 == '\\') || (cVar1 == '/')) {
      for (; ((cVar1 = *pcVar6, lVar9 = 1, cVar1 == '\\' || (cVar1 == '/')) ||
             ((cVar1 == '.' && (lVar9 = 2, pcVar6[1] == '.')))); pcVar6 = pcVar6 + lVar9) {
      }
    }
  }
  *pcVar8 = '\0';
  snprintf(path,0x1000,"%s%s",pcVar5,uri);
  iVar3 = is_dav_request(&phVar2->method);
  if ((iVar3 != 0) && (opts.dav_document_root != (char *)0x0)) {
    snprintf(path,0x1000,"%s%s",opts.dav_document_root,uri);
  }
  do {
    list = mg_next_comma_list_entry(list,&b,&local_2048);
    uVar4 = (uint)b.len;
    pcVar6 = b.p;
    if (list == (char *)0x0) goto LAB_0010f0d4;
    if ((((1 < CONCAT44(b.len._4_4_,(uint)b.len)) && (*b.p == '@' && local_2068 != (mg_str *)0x0))
        && (local_2068->len == CONCAT44(b.len._4_4_,(uint)b.len) - 1)) &&
       (iVar3 = mg_ncasecmp(b.p + 1,local_2068->p,local_2068->len), iVar3 == 0)) goto LAB_0010f0c8;
    uVar4 = mg_match_prefix(pcVar6,uVar4,uri);
  } while ((int)uVar4 < 1);
  puVar7 = auStack_2078 + uVar4;
LAB_0010f0c8:
  snprintf(path,0x1000,"%.*s%s",(ulong)(uint)local_2048.len,local_2048.p,puVar7 + 0x40);
LAB_0010f0d4:
  phVar2 = local_2070;
  mg_send_http_file(local_2060,path,0x1000,local_2070,&opts);
  iVar3 = mg_vcmp(&phVar2->proto,"HTTP/1.1");
  if (iVar3 != 0) {
    return;
  }
  mg_get_http_header(phVar2,"Connection");
  return;
}

Assistant:

void mg_serve_http(struct mg_connection *nc, struct http_message *hm,
                   struct mg_serve_http_opts opts) {
    char path[MG_MAX_PATH];
    struct mg_str *hdr;

    if (send_port_based_redirect(nc, hm, &opts)) {
        return;
    }

    if (opts.document_root == NULL) {
        opts.document_root = ".";
    }
    if (opts.per_directory_auth_file == NULL) {
        opts.per_directory_auth_file = ".htpasswd";
    }
    if (opts.enable_directory_listing == NULL) {
        opts.enable_directory_listing = "yes";
    }
    if (opts.cgi_file_pattern == NULL) {
        opts.cgi_file_pattern = "**.cgi$|**.php$";
    }
    if (opts.ssi_pattern == NULL) {
        opts.ssi_pattern = "**.shtml$|**.shtm$";
    }
    if (opts.index_files == NULL) {
        opts.index_files = "index.html,index.htm,index.shtml,index.cgi,index.php";
    }

    uri_to_path(hm, path, sizeof(path), &opts);
    mg_send_http_file(nc, path, sizeof(path), hm, &opts);

    /* Close connection for non-keep-alive requests */
    if (mg_vcmp(&hm->proto, "HTTP/1.1") != 0 ||
        ((hdr = mg_get_http_header(hm, "Connection")) != NULL &&
         mg_vcmp(hdr, "keep-alive") != 0)) {
#if 0
        nc->flags |= MG_F_SEND_AND_CLOSE;
#endif
    }
}